

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  __int_type_conflict3 _Var2;
  long lVar3;
  CleanupNode *pCVar4;
  SerialArena *this_00;
  string *psVar5;
  CleanupNode *pCVar6;
  ulong uVar7;
  ThreadSafeArena *this_01;
  ulong uVar8;
  LogMessageFatal aLStack_40 [16];
  ThreadSafeArena *pTStack_30;
  
  this_01 = (ThreadSafeArena *)&stack0xffffffffffffffd8;
  pTStack_30 = (ThreadSafeArena *)0x1cab22;
  lVar3 = __tls_get_addr(&PTR_004be9d0);
  if (*(uint64_t *)(lVar3 + 8) != this->tag_and_id_) goto LAB_001cab83;
  this = *(ThreadSafeArena **)(lVar3 + 0x10);
  while( true ) {
    pCVar4 = (CleanupNode *)(this->head_)._M_b._M_p;
    if (pCVar4 < (CleanupNode *)this->first_owner_) {
      (this->head_)._M_b._M_p = (__pointer_type)(pCVar4 + 1);
      pCVar4->elem = elem;
      pCVar4->destructor = cleanup;
    }
    else {
      pTStack_30 = (ThreadSafeArena *)0x1caba7;
      internal::cleanup::ChunkList::AddFallback
                ((ChunkList *)&this->mutex_,elem,cleanup,(SerialArena *)this);
    }
    pCVar4 = (CleanupNode *)(this->first_arena_).ptr_._M_b._M_p;
    if ((pCVar4 == (CleanupNode *)0x0) ||
       ((CleanupNode *)((ChunkList *)&this->mutex_)->head_ <= pCVar4)) break;
    pTStack_30 = (ThreadSafeArena *)0x1cab83;
    AddCleanup((ThreadSafeArena *)&stack0xffffffffffffffd8);
LAB_001cab83:
    pTStack_30 = (ThreadSafeArena *)0x1cab90;
    this = (ThreadSafeArena *)GetSerialArenaFallback(this,0x10);
  }
  pCVar1 = (CleanupNode *)(this->head_)._M_b._M_p;
  if (((long)pCVar4 - (long)pCVar1 < 0x181) &&
     (pCVar6 = (CleanupNode *)this->first_owner_, pCVar4 < pCVar6)) {
    if (pCVar1 < pCVar4) {
      pCVar1 = pCVar4;
    }
    pCVar4 = pCVar1;
    if (pCVar4 == (CleanupNode *)0x0) {
      pTStack_30 = (ThreadSafeArena *)AllocateFromStringBlock;
      AddCleanup((ThreadSafeArena *)&stack0xffffffffffffffd8);
      pTStack_30 = this;
      lVar3 = __tls_get_addr(&PTR_004be9d0);
      if (*(uint64_t *)(lVar3 + 8) == this_01->tag_and_id_) {
        this_00 = *(SerialArena **)(lVar3 + 0x10);
      }
      else {
        this_00 = GetSerialArenaFallback(this_01,0x10);
      }
      _Var2 = (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var2 == 0) {
        SerialArena::AllocateFromStringBlockFallback(this_00);
        return;
      }
      uVar8 = _Var2 - 0x20;
      (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar8;
      uVar7 = (ulong)((this_00->string_block_)._M_b._M_p)->allocated_size_ - 0x10;
      if (uVar7 < uVar8) {
        psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                           (uVar8,uVar7,"offset <= effective_size()");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/string_block.h"
                   ,0xa2,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_40);
      }
      return;
    }
    if (pCVar4 + 0x18 < pCVar6) {
      pCVar6 = pCVar4 + 0x18;
    }
    for (; pCVar4 < pCVar6; pCVar4 = pCVar4 + 4) {
    }
  }
  (this->first_arena_).ptr_._M_b._M_p = (__pointer_type)pCVar4;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}